

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  string *filename;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference old_prefix;
  reference pvVar4;
  int *piVar5;
  LogMessage *pLVar6;
  bool local_101;
  LogFinisher local_e1;
  LogMessage local_e0;
  int local_a4;
  DiskSourceTree *local_a0;
  ZeroCopyInputStream *stream;
  string temp_disk_file;
  int i;
  string local_68;
  string local_48;
  string *local_28;
  string *disk_file_local;
  string *virtual_file_local;
  DiskSourceTree *this_local;
  
  local_28 = disk_file;
  disk_file_local = virtual_file;
  virtual_file_local = (string *)this;
  std::__cxx11::string::string((string *)&local_68,(string *)virtual_file);
  CanonicalizePath(&local_48,&local_68);
  bVar1 = std::operator!=(virtual_file,&local_48);
  local_101 = true;
  if (!bVar1) {
    local_101 = ContainsParentReference(disk_file_local);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_101 == false) {
    for (temp_disk_file.field_2._8_4_ = 0; uVar2 = (ulong)(int)temp_disk_file.field_2._8_4_,
        sVar3 = std::
                vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                ::size(&this->mappings_), uVar2 < sVar3;
        temp_disk_file.field_2._8_4_ = temp_disk_file.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)&stream);
      filename = disk_file_local;
      old_prefix = std::
                   vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                   ::operator[](&this->mappings_,(long)(int)temp_disk_file.field_2._8_4_);
      pvVar4 = std::
               vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ::operator[](&this->mappings_,(long)(int)temp_disk_file.field_2._8_4_);
      bVar1 = ApplyMapping(filename,&old_prefix->virtual_path,&pvVar4->disk_path,(string *)&stream);
      if (bVar1) {
        local_a0 = (DiskSourceTree *)OpenDiskFile(this,(string *)&stream);
        if (local_a0 == (DiskSourceTree *)0x0) {
          piVar5 = __errno_location();
          if (*piVar5 != 0xd) goto LAB_0034a8e2;
          internal::LogMessage::LogMessage
                    (&local_e0,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/importer.cc"
                     ,0x1b1);
          pLVar6 = internal::LogMessage::operator<<(&local_e0,"Read access is denied for file: ");
          pLVar6 = internal::LogMessage::operator<<(pLVar6,(string *)&stream);
          internal::LogFinisher::operator=(&local_e1,pLVar6);
          internal::LogMessage::~LogMessage(&local_e0);
          this_local = (DiskSourceTree *)0x0;
          local_a4 = 1;
        }
        else {
          if (local_28 != (string *)0x0) {
            std::__cxx11::string::operator=((string *)local_28,(string *)&stream);
          }
          this_local = local_a0;
          local_a4 = 1;
        }
      }
      else {
LAB_0034a8e2:
        local_a4 = 0;
      }
      std::__cxx11::string::~string((string *)&stream);
      if (local_a4 != 0) {
        return (ZeroCopyInputStream *)this_local;
      }
    }
  }
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const string& virtual_file,
    string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    return NULL;
  }

  for (int i = 0; i < mappings_.size(); i++) {
    string temp_disk_file;
    if (ApplyMapping(virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        // TODO(kenton):  Find a way to report this more nicely.
        GOOGLE_LOG(WARNING) << "Read access is denied for file: " << temp_disk_file;
        return NULL;
      }
    }
  }

  return NULL;
}